

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::is_stage_output_block_member_masked
          (CompilerGLSL *this,SPIRVariable *var,uint32_t index,bool strip_array)

{
  bool bVar1;
  uint32_t location;
  uint32_t component;
  SPIRType *type;
  BuiltIn builtin;
  
  type = Compiler::get<spirv_cross::SPIRType>
                   (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
  bVar1 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock);
  if (bVar1) {
    builtin = BuiltInMax;
    bVar1 = Compiler::is_member_builtin(&this->super_Compiler,type,index,&builtin);
    if (bVar1) {
      bVar1 = is_stage_output_builtin_masked(this,builtin);
    }
    else {
      location = get_declared_member_location(this,var,index,strip_array);
      component = Compiler::get_member_decoration
                            (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationComponent);
      bVar1 = is_stage_output_location_masked(this,location,component);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CompilerGLSL::is_stage_output_block_member_masked(const SPIRVariable &var, uint32_t index, bool strip_array) const
{
	auto &type = get<SPIRType>(var.basetype);
	bool is_block = has_decoration(type.self, DecorationBlock);
	if (!is_block)
		return false;

	BuiltIn builtin = BuiltInMax;
	if (is_member_builtin(type, index, &builtin))
	{
		return is_stage_output_builtin_masked(builtin);
	}
	else
	{
		uint32_t location = get_declared_member_location(var, index, strip_array);
		uint32_t component = get_member_decoration(type.self, index, DecorationComponent);
		return is_stage_output_location_masked(location, component);
	}
}